

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-formulas.c
# Opt level: O0

math_section * parse_condition(char *line,char *full_line)

{
  char *pcVar1;
  size_t sVar2;
  char *start;
  char *full_line_local;
  char *line_local;
  
  pcVar1 = strchr(line,0x28);
  if (pcVar1 == (char *)0x0) {
    borg_formula_error(line,full_line,"condition",(char *)0x0);
    line_local = (char *)0x0;
  }
  else {
    pcVar1 = pcVar1 + 1;
    sVar2 = strlen(pcVar1);
    if (pcVar1[sVar2 - 1] == ')') {
      sVar2 = strlen(pcVar1);
      pcVar1[sVar2 - 1] = '\0';
      line_local = &parse_formula_section(pcVar1,full_line)->is_calculation;
    }
    else {
      borg_formula_error(line,full_line,"condition","** no ending \')\'");
      line_local = (char *)0x0;
    }
  }
  return (math_section *)line_local;
}

Assistant:

static struct math_section *parse_condition(char *line, const char *full_line)
{
    char *start = line;
    line        = strchr(line, '(');
    if (!line) {
        borg_formula_error(start, full_line, "condition", NULL);
        return NULL;
    }

    /* skip the "(" */
    line++;

    /* remove the end ) */
    if (line[strlen(line) - 1] != ')') {
        borg_formula_error(start, full_line, "condition", "** no ending ')'");
        return NULL;
    }
    line[strlen(line) - 1] = 0;

    return parse_formula_section(line, full_line);
}